

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O3

void __thiscall
diligent_spirv_cross::DominatorBuilder::lift_continue_block_dominator(DominatorBuilder *this)

{
  int iVar1;
  size_t sVar2;
  Case *pCVar3;
  bool bVar4;
  uint32_t uVar5;
  uint uVar6;
  uint32_t uVar7;
  SPIRBlock *block;
  SmallVector<diligent_spirv_cross::SPIRBlock::Case,_8UL> *pSVar8;
  long lVar9;
  
  if ((ulong)this->dominator == 0) {
    return;
  }
  block = Variant::get<diligent_spirv_cross::SPIRBlock>
                    ((this->cfg->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.
                     ptr + this->dominator);
  uVar5 = CFG::get_visit_order(this->cfg,this->dominator);
  iVar1 = *(int *)&(block->super_IVariant).field_0xc;
  if (iVar1 == 3) {
    pSVar8 = Compiler::get_case_list(this->cfg->compiler,block);
    sVar2 = (pSVar8->super_VectorView<diligent_spirv_cross::SPIRBlock::Case>).buffer_size;
    if (sVar2 == 0) {
      bVar4 = false;
    }
    else {
      pCVar3 = (pSVar8->super_VectorView<diligent_spirv_cross::SPIRBlock::Case>).ptr;
      lVar9 = 0;
      bVar4 = false;
      do {
        uVar7 = CFG::get_visit_order(this->cfg,*(uint32_t *)((long)&(pCVar3->block).id + lVar9));
        bVar4 = (bool)(bVar4 | uVar5 < uVar7);
        lVar9 = lVar9 + 0x10;
      } while (sVar2 << 4 != lVar9);
    }
    uVar7 = (block->default_block).id;
    if (uVar7 != 0) {
      uVar7 = CFG::get_visit_order(this->cfg,uVar7);
      bVar4 = (bool)(uVar5 < uVar7 | bVar4);
    }
    if (!bVar4) {
      return;
    }
  }
  else {
    if (iVar1 == 2) {
      uVar7 = CFG::get_visit_order(this->cfg,(block->true_block).id);
      uVar6 = CFG::get_visit_order(this->cfg,(block->false_block).id);
      if (uVar5 < uVar7) goto LAB_0034a0f4;
    }
    else {
      if (iVar1 != 1) {
        return;
      }
      uVar6 = CFG::get_visit_order(this->cfg,(block->next_block).id);
    }
    if (uVar6 <= uVar5) {
      return;
    }
  }
LAB_0034a0f4:
  this->dominator = (this->cfg->func->entry_block).id;
  return;
}

Assistant:

void DominatorBuilder::lift_continue_block_dominator()
{
	// It is possible for a continue block to be the dominator of a variable is only accessed inside the while block of a do-while loop.
	// We cannot safely declare variables inside a continue block, so move any variable declared
	// in a continue block to the entry block to simplify.
	// It makes very little sense for a continue block to ever be a dominator, so fall back to the simplest
	// solution.

	if (!dominator)
		return;

	auto &block = cfg.get_compiler().get<SPIRBlock>(dominator);
	auto post_order = cfg.get_visit_order(dominator);

	// If we are branching to a block with a higher post-order traversal index (continue blocks), we have a problem
	// since we cannot create sensible GLSL code for this, fallback to entry block.
	bool back_edge_dominator = false;
	switch (block.terminator)
	{
	case SPIRBlock::Direct:
		if (cfg.get_visit_order(block.next_block) > post_order)
			back_edge_dominator = true;
		break;

	case SPIRBlock::Select:
		if (cfg.get_visit_order(block.true_block) > post_order)
			back_edge_dominator = true;
		if (cfg.get_visit_order(block.false_block) > post_order)
			back_edge_dominator = true;
		break;

	case SPIRBlock::MultiSelect:
	{
		auto &cases = cfg.get_compiler().get_case_list(block);
		for (auto &target : cases)
		{
			if (cfg.get_visit_order(target.block) > post_order)
				back_edge_dominator = true;
		}
		if (block.default_block && cfg.get_visit_order(block.default_block) > post_order)
			back_edge_dominator = true;
		break;
	}

	default:
		break;
	}

	if (back_edge_dominator)
		dominator = cfg.get_function().entry_block;
}